

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_utils.hpp
# Opt level: O2

streampos __thiscall ELFIO::address_translator::operator[](address_translator *this,streampos value)

{
  pointer paVar1;
  const_iterator __begin2;
  pointer paVar2;
  __mbstate_t _Var3;
  long lVar4;
  long lVar5;
  streampos sVar6;
  
  _Var3 = value._M_state;
  lVar5 = value._M_off;
  paVar2 = (this->addr_translations).
           super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar1 = (this->addr_translations).
           super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (paVar2 != paVar1) {
    for (; paVar2 != paVar1; paVar2 = paVar2 + 0x30) {
      lVar4 = lVar5 - *(long *)paVar2;
      if ((*(long *)paVar2 <= lVar5) && (lVar4 < *(long *)(paVar2 + 0x10))) {
        lVar5 = lVar4 + *(long *)(paVar2 + 0x20);
        _Var3.__count = 0;
        _Var3.__value = (anon_union_4_2_91654ee9_for___value)0x0;
        break;
      }
    }
  }
  sVar6._M_state = _Var3;
  sVar6._M_off = lVar5;
  return sVar6;
}

Assistant:

std::streampos operator[]( std::streampos value ) const
    {
        if ( addr_translations.empty() ) {
            return value;
        }

        for ( auto& t : addr_translations ) {
            if ( ( t.start <= value ) && ( ( value - t.start ) < t.size ) ) {
                return value - t.start + t.mapped_to;
            }
        }

        return value;
    }